

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIso.c
# Opt level: O1

int Iso_ManNegEdgeNum(Aig_Man_t *pAig)

{
  void *pvVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  
  if (pAig->nComplEdges < 1) {
    lVar3 = (long)pAig->vObjs->nSize;
    if (lVar3 < 1) {
      iVar2 = 0;
    }
    else {
      lVar4 = 0;
      iVar2 = 0;
      do {
        pvVar1 = pAig->vObjs->pArray[lVar4];
        if (pvVar1 != (void *)0x0) {
          uVar5 = (uint)*(undefined8 *)((long)pvVar1 + 0x18);
          if ((uVar5 & 7) - 7 < 0xfffffffe) {
            if ((uVar5 & 7) == 3) {
              iVar2 = iVar2 + (*(uint *)((long)pvVar1 + 8) & 1);
            }
          }
          else {
            iVar2 = (*(uint *)((long)pvVar1 + 0x10) & 1) + (*(uint *)((long)pvVar1 + 8) & 1) + iVar2
            ;
          }
        }
        lVar4 = lVar4 + 1;
      } while (lVar3 != lVar4);
    }
    pAig->nComplEdges = iVar2;
    return iVar2;
  }
  return pAig->nComplEdges;
}

Assistant:

int Iso_ManNegEdgeNum( Aig_Man_t * pAig )
{
    Aig_Obj_t * pObj;
    int i, Counter = 0;
    if ( pAig->nComplEdges > 0 )
        return pAig->nComplEdges;
    Aig_ManForEachObj( pAig, pObj, i )
        if ( Aig_ObjIsNode(pObj) )
        {
            Counter += Aig_ObjFaninC0(pObj);
            Counter += Aig_ObjFaninC1(pObj);
        }
        else if ( Aig_ObjIsCo(pObj) )
            Counter += Aig_ObjFaninC0(pObj);
    return (pAig->nComplEdges = Counter);
}